

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O2

void __thiscall MedianFilterCV_8U::filter(MedianFilterCV_8U *this)

{
  uchar uVar1;
  pair<unsigned_char,_unsigned_char> pVar2;
  Mat *pMVar3;
  ulong uVar4;
  int y;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  pMVar3 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(pMVar3,*(int *)(this->sourceImage + 8),*(int *)(this->sourceImage + 0xc),0);
  this->resultImage = pMVar3;
  pMVar3 = this->sourceImage;
  for (lVar6 = 1; uVar4 = (ulong)*(int *)(pMVar3 + 8), lVar7 = 1, lVar6 < (long)(uVar4 - 1);
      lVar6 = lVar6 + 1) {
    for (; lVar7 < (long)*(int *)(pMVar3 + 0xc) + -2; lVar7 = lVar7 + 2) {
      iVar5 = (int)lVar6;
      iVar8 = (int)lVar7;
      pVar2 = getPairMedian(this,pMVar3,iVar5,iVar8,false);
      uVar1 = getActualPixel(this,pVar2.first,iVar5,iVar8);
      *(uchar *)(lVar7 + **(long **)(this->resultImage + 0x48) * lVar6 +
                         *(long *)(this->resultImage + 0x10)) = uVar1;
      uVar1 = getActualPixel(this,pVar2.second,iVar5,iVar8 + 1);
      *(uchar *)(lVar7 + 1 +
                **(long **)(this->resultImage + 0x48) * lVar6 + *(long *)(this->resultImage + 0x10))
           = uVar1;
      pMVar3 = this->sourceImage;
    }
  }
  if ((*(uint *)(pMVar3 + 0xc) & 0x80000001) == 1) {
    lVar7 = (long)(int)*(uint *)(pMVar3 + 0xc) + -2;
    lVar6 = 1;
    while( true ) {
      iVar5 = (uint)uVar4 - 2;
      iVar8 = (int)lVar7;
      if (iVar5 <= lVar6) break;
      pVar2 = getPairMedian(this,pMVar3,(int)lVar6,iVar8,true);
      uVar1 = getActualPixel(this,pVar2.first,(int)lVar6,iVar8);
      *(uchar *)(lVar7 + **(long **)(this->resultImage + 0x48) * lVar6 +
                         *(long *)(this->resultImage + 0x10)) = uVar1;
      uVar1 = getActualPixel(this,pVar2.second,(int)(lVar6 + 1),iVar8);
      *(uchar *)(lVar7 + (lVar6 + 1) * **(long **)(this->resultImage + 0x48) +
                         *(long *)(this->resultImage + 0x10)) = uVar1;
      pMVar3 = this->sourceImage;
      uVar4 = (ulong)*(uint *)(pMVar3 + 8);
      lVar6 = lVar6 + 2;
    }
    if (((uint)uVar4 & 0x80000001) == 1) {
      uVar1 = getMedian(this,pMVar3,iVar5,iVar8);
      uVar1 = getActualPixel(this,uVar1,iVar5,iVar8);
      *(uchar *)((long)*(int *)(this->sourceImage + 0xc) + -2 +
                ((long)*(int *)(this->sourceImage + 8) + -2) * **(long **)(this->resultImage + 0x48)
                + *(long *)(this->resultImage + 0x10)) = uVar1;
      pMVar3 = this->sourceImage;
    }
  }
  filterImageEdges(this,pMVar3);
  return;
}

Assistant:

void MedianFilterCV_8U::filter() {
    resultImage = new cv::Mat(sourceImage->rows, sourceImage->cols, CV_8U);

    std::pair<uchar, uchar> pairOfMedians;                                // 1 operation
    for (int y = 1; y < sourceImage->rows - 1; ++y) {                     // 1 + 5 operations at every step (539 steps if rows=1080)
        for (int x = 1; x < sourceImage->cols - 2; x += 2) {              // 1 + 5 operations at every step (959 steps if cols=1920)
            pairOfMedians = getPairMedian(*sourceImage, y, x, false);     // 1 operation + operations of getPairMedian(420/567)

            resultImage->at<uchar>(y, x) = getActualPixel(pairOfMedians.first, y, x);          // 2 operations + operations of getActual(9)
            resultImage->at<uchar>(y, x + 1) = getActualPixel(pairOfMedians.second, y, x + 1); // 4 operations + operations of getActual(9)
        }
    }

    // if the last two columns are not processed
    if (sourceImage->cols % 2 == 1) {                                     // 3 operations
        int x = sourceImage->cols - 2;                                    // 3 operations

        for (int y = 1; y < sourceImage->rows - 2; y += 2) {              // 1 + 5 operations at every step
            pairOfMedians = getPairMedian(*sourceImage, y, x, true);      // 2 operations + operations of getPairMedian (420/567)
            resultImage->at<uchar>(y, x) = getActualPixel(pairOfMedians.first, y, x);          // 3 operations + operations of getActual(9)
            resultImage->at<uchar>(y + 1, x) = getActualPixel(pairOfMedians.second, y + 1, x); // 5 operations + operations of getActual(9)
        }

        if (sourceImage->rows % 2 == 1) {
            int y = sourceImage->rows - 2;                                // 3 operations
            resultImage->at<uchar>(sourceImage->rows - 2, sourceImage->cols - 2) =
                    getActualPixel(getMedian(*sourceImage, y, x), y, x);  // 6 operations + operations of getActaulPixel
                                                                          // and getMedian
        }
    }

    filterImageEdges(*sourceImage);                                       // 1 operations + operations of filterImageEdges
}